

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O2

ngx_int_t ngx_inet_resolve_host(ngx_pool_t *pool,ngx_url_t *u)

{
  addrinfo *paVar1;
  long lVar2;
  ngx_pool_t *pnVar3;
  int iVar4;
  u_char *puVar5;
  void *pvVar6;
  sockaddr *psVar7;
  size_t sVar8;
  long lVar9;
  addrinfo **ppaVar10;
  long lVar11;
  addrinfo local_88;
  ngx_pool_t *local_50;
  addrinfo *local_48;
  addrinfo *res;
  in_port_t local_32;
  
  local_32 = u->port;
  puVar5 = (u_char *)ngx_alloc((u->host).len + 1,pool->log);
  if (puVar5 != (u_char *)0x0) {
    ngx_cpystrn(puVar5,(u->host).data,(u->host).len + 1);
    local_88.ai_addrlen = 0;
    local_88._20_4_ = 0;
    local_88.ai_addr = (sockaddr *)0x0;
    local_88.ai_canonname = (char *)0x0;
    local_88.ai_next = (addrinfo *)0x0;
    local_88.ai_socktype = 1;
    local_88.ai_protocol = 0;
    local_88.ai_flags = 0x20;
    local_88.ai_family = 0;
    ppaVar10 = &local_48;
    iVar4 = getaddrinfo((char *)puVar5,(char *)0x0,&local_88,ppaVar10);
    if (iVar4 == 0) {
      local_32 = local_32 << 8 | local_32 >> 8;
      res = (addrinfo *)u;
      free(puVar5);
      lVar9 = 0;
      while (paVar1 = *ppaVar10, paVar1 != (addrinfo *)0x0) {
        if ((paVar1->ai_family | 8U) == 10) {
          lVar9 = lVar9 + 1;
        }
        ppaVar10 = &paVar1->ai_next;
      }
      if (lVar9 == 0) {
        *(char **)&res[4].ai_addrlen = "host not found";
      }
      else {
        pvVar6 = ngx_pcalloc(pool,lVar9 << 5);
        *(void **)(res + 4) = pvVar6;
        if (pvVar6 != (void *)0x0) {
          res[4].ai_socktype = (int)lVar9;
          res[4].ai_protocol = (int)((ulong)lVar9 >> 0x20);
          lVar9 = 0;
          ppaVar10 = &local_48;
          local_50 = pool;
          while (pnVar3 = local_50, paVar1 = *ppaVar10, paVar1 != (addrinfo *)0x0) {
            if (paVar1->ai_family == 2) {
              psVar7 = (sockaddr *)ngx_pcalloc(local_50,(ulong)paVar1->ai_addrlen);
              if (psVar7 == (sockaddr *)0x0) goto LAB_00119739;
              memcpy(psVar7,paVar1->ai_addr,(ulong)paVar1->ai_addrlen);
              *(in_port_t *)psVar7->sa_data = local_32;
              lVar2 = *(long *)(res + 4);
              lVar11 = lVar9 * 0x20;
              *(sockaddr **)(lVar2 + lVar11) = psVar7;
              *(socklen_t *)(lVar2 + 8 + lVar11) = paVar1->ai_addrlen;
              puVar5 = (u_char *)ngx_pnalloc(pnVar3,0x15);
              if (puVar5 == (u_char *)0x0) goto LAB_00119739;
              sVar8 = ngx_sock_ntop(psVar7,paVar1->ai_addrlen,puVar5,0x15,1);
              lVar2 = *(long *)(res + 4);
              *(size_t *)(lVar2 + 0x10 + lVar11) = sVar8;
              *(u_char **)(lVar2 + 0x18 + lVar11) = puVar5;
              lVar9 = lVar9 + 1;
            }
            ppaVar10 = &paVar1->ai_next;
          }
          ppaVar10 = &local_48;
          do {
            pnVar3 = local_50;
            paVar1 = *ppaVar10;
            if (paVar1 == (addrinfo *)0x0) {
              freeaddrinfo(local_48);
              return 0;
            }
            if (paVar1->ai_family == 10) {
              psVar7 = (sockaddr *)ngx_pcalloc(local_50,(ulong)paVar1->ai_addrlen);
              if (psVar7 == (sockaddr *)0x0) break;
              memcpy(psVar7,paVar1->ai_addr,(ulong)paVar1->ai_addrlen);
              *(in_port_t *)psVar7->sa_data = local_32;
              lVar2 = *(long *)(res + 4);
              lVar11 = lVar9 * 0x20;
              *(sockaddr **)(lVar2 + lVar11) = psVar7;
              *(socklen_t *)(lVar2 + 8 + lVar11) = paVar1->ai_addrlen;
              puVar5 = (u_char *)ngx_pnalloc(pnVar3,0x35);
              if (puVar5 == (u_char *)0x0) break;
              sVar8 = ngx_sock_ntop(psVar7,paVar1->ai_addrlen,puVar5,0x35,1);
              lVar2 = *(long *)(res + 4);
              *(size_t *)(lVar2 + 0x10 + lVar11) = sVar8;
              *(u_char **)(lVar2 + 0x18 + lVar11) = puVar5;
              lVar9 = lVar9 + 1;
            }
            ppaVar10 = &paVar1->ai_next;
          } while( true );
        }
      }
LAB_00119739:
      freeaddrinfo(local_48);
    }
    else {
      u->err = "host not found";
      free(puVar5);
    }
  }
  return -1;
}

Assistant:

ngx_int_t
ngx_inet_resolve_host(ngx_pool_t *pool, ngx_url_t *u)
{
    u_char               *p, *host;
    size_t                len;
    in_port_t             port;
    ngx_uint_t            i;
    struct addrinfo       hints, *res, *rp;
    struct sockaddr_in   *sin;
    struct sockaddr_in6  *sin6;

    port = htons(u->port);

    host = ngx_alloc(u->host.len + 1, pool->log);
    if (host == NULL) {
        return NGX_ERROR;
    }

    (void) ngx_cpystrn(host, u->host.data, u->host.len + 1);

    ngx_memzero(&hints, sizeof(struct addrinfo));
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;
#ifdef AI_ADDRCONFIG
    hints.ai_flags = AI_ADDRCONFIG;
#endif

    if (getaddrinfo((char *) host, NULL, &hints, &res) != 0) {
        u->err = "host not found";
        ngx_free(host);
        return NGX_ERROR;
    }

    ngx_free(host);

    for (i = 0, rp = res; rp != NULL; rp = rp->ai_next) {

        switch (rp->ai_family) {

        case AF_INET:
        case AF_INET6:
            break;

        default:
            continue;
        }

        i++;
    }

    if (i == 0) {
        u->err = "host not found";
        goto failed;
    }

    /* MP: ngx_shared_palloc() */

    u->addrs = ngx_pcalloc(pool, i * sizeof(ngx_addr_t));
    if (u->addrs == NULL) {
        goto failed;
    }

    u->naddrs = i;

    i = 0;

    /* AF_INET addresses first */

    for (rp = res; rp != NULL; rp = rp->ai_next) {

        if (rp->ai_family != AF_INET) {
            continue;
        }

        sin = ngx_pcalloc(pool, rp->ai_addrlen);
        if (sin == NULL) {
            goto failed;
        }

        ngx_memcpy(sin, rp->ai_addr, rp->ai_addrlen);

        sin->sin_port = port;

        u->addrs[i].sockaddr = (struct sockaddr *) sin;
        u->addrs[i].socklen = rp->ai_addrlen;

        len = NGX_INET_ADDRSTRLEN + sizeof(":65535") - 1;

        p = ngx_pnalloc(pool, len);
        if (p == NULL) {
            goto failed;
        }

        len = ngx_sock_ntop((struct sockaddr *) sin, rp->ai_addrlen, p, len, 1);

        u->addrs[i].name.len = len;
        u->addrs[i].name.data = p;

        i++;
    }

    for (rp = res; rp != NULL; rp = rp->ai_next) {

        if (rp->ai_family != AF_INET6) {
            continue;
        }

        sin6 = ngx_pcalloc(pool, rp->ai_addrlen);
        if (sin6 == NULL) {
            goto failed;
        }

        ngx_memcpy(sin6, rp->ai_addr, rp->ai_addrlen);

        sin6->sin6_port = port;

        u->addrs[i].sockaddr = (struct sockaddr *) sin6;
        u->addrs[i].socklen = rp->ai_addrlen;

        len = NGX_INET6_ADDRSTRLEN + sizeof("[]:65535") - 1;

        p = ngx_pnalloc(pool, len);
        if (p == NULL) {
            goto failed;
        }

        len = ngx_sock_ntop((struct sockaddr *) sin6, rp->ai_addrlen, p,
                            len, 1);

        u->addrs[i].name.len = len;
        u->addrs[i].name.data = p;

        i++;
    }

    freeaddrinfo(res);
    return NGX_OK;

failed:

    freeaddrinfo(res);
    return NGX_ERROR;
}